

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Integer MA_inquire_stack_check_heap(Integer datatype)

{
  long lVar1;
  long in_RDI;
  ulongi unaff_retaddr;
  Integer nelem_gap;
  size_t gap_length;
  Pointer local_28;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  Integer in_stack_fffffffffffffff8;
  Integer IVar2;
  
  ma_stats.calls[0x12] = ma_stats.calls[0x12] + 1;
  if (ma_initialized == 0) {
    sprintf(ma_ebuf,"MA not yet initialized");
    ma_error((ErrorLevel)((ulong)in_RDI >> 0x20),(ErrorType)in_RDI,in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0);
    IVar2 = 0;
  }
  else if ((in_RDI < 1000) || (0x3f8 < in_RDI)) {
    sprintf(ma_ebuf,"invalid datatype: %ld",in_RDI);
    ma_error((ErrorLevel)((ulong)in_RDI >> 0x20),(ErrorType)in_RDI,in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0);
    IVar2 = 0;
  }
  else {
    if ((ulong)((long)ma_sp - (long)ma_hp) < (ulong)((long)ma_sp - (long)ma_partition)) {
      lVar1 = -(long)ma_hp;
    }
    else {
      lVar1 = -(long)ma_partition;
    }
    local_28 = ma_sp + lVar1;
    if (local_28 == (Pointer)0x0) {
      IVar2 = 0;
    }
    else {
      IVar2 = ma_nelem((Pointer)nelem_gap,unaff_retaddr,in_stack_fffffffffffffff8);
    }
  }
  return IVar2;
}

Assistant:

public Integer MA_inquire_stack_check_heap(Integer datatype)
{
    size_t    gap_length;    /* # of bytes between partition and stack */
    Integer    nelem_gap;    /* max elements containable in gap */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_inquire_stack_check_heap]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return DONTCARE;
#endif /* VERIFY */

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "MA not yet initialized");
        ma_error(EL_Nonfatal, ET_External, "MA_inquire_stack_check_heap", ma_ebuf);
        return (Integer)0;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Fatal, ET_External, "MA_inquire_stack_check_heap", ma_ebuf);
        return DONTCARE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * compute the # of elements for which space is available
     */

    /* try space between partition and stack or heap and stack */
    gap_length = min((size_t)(ma_sp - ma_partition), (size_t)(ma_sp - ma_hp));
    if (gap_length > 0)
        nelem_gap = ma_nelem(ma_partition, (ulongi)gap_length, datatype);
    else
        nelem_gap = 0;

    /* success */
    return nelem_gap;
}